

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_format ma_data_converter_config_get_mid_format(ma_data_converter_config *pConfig)

{
  ma_bool32 mVar1;
  ma_data_converter_config *in_RDI;
  ma_format local_4;
  
  mVar1 = ma_data_converter_config_is_resampler_required(in_RDI);
  if ((mVar1 == 0) || ((in_RDI->resampling).algorithm == ma_resample_algorithm_linear)) {
    if ((in_RDI->formatOut == ma_format_s16) || (in_RDI->formatOut == ma_format_f32)) {
      local_4 = in_RDI->formatOut;
    }
    else if ((in_RDI->formatIn == ma_format_s16) || (in_RDI->formatIn == ma_format_f32)) {
      local_4 = in_RDI->formatIn;
    }
    else {
      local_4 = ma_format_f32;
    }
  }
  else {
    local_4 = ma_format_f32;
  }
  return local_4;
}

Assistant:

static ma_format ma_data_converter_config_get_mid_format(const ma_data_converter_config* pConfig)
{
    MA_ASSERT(pConfig != NULL);

    /*
    We want to avoid as much data conversion as possible. The channel converter and linear
    resampler both support s16 and f32 natively. We need to decide on the format to use for this
    stage. We call this the mid format because it's used in the middle stage of the conversion
    pipeline. If the output format is either s16 or f32 we use that one. If that is not the case it
    will do the same thing for the input format. If it's neither we just use f32. If we are using a
    custom resampling backend, we can only guarantee that f32 will be supported so we'll be forced
    to use that if resampling is required.
    */
    if (ma_data_converter_config_is_resampler_required(pConfig) && pConfig->resampling.algorithm != ma_resample_algorithm_linear) {
        return ma_format_f32;  /* <-- Force f32 since that is the only one we can guarantee will be supported by the resampler. */
    } else {
        /*  */ if (pConfig->formatOut == ma_format_s16 || pConfig->formatOut == ma_format_f32) {
            return pConfig->formatOut;
        } else if (pConfig->formatIn  == ma_format_s16 || pConfig->formatIn  == ma_format_f32) {
            return pConfig->formatIn;
        } else {
            return ma_format_f32;
        }
    }
}